

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# postscript.h
# Opt level: O0

void __thiscall Gecko::PostScript::edge(PostScript *this,Float xi,Float xj,Float weight,bool top)

{
  double *pdVar1;
  byte in_SIL;
  long in_RDI;
  float in_XMM0_Da;
  double dVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  double r;
  double y;
  double h;
  double d;
  double x;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  byte local_15;
  float local_14;
  float local_10;
  float local_c;
  
  local_15 = in_SIL & 1;
  local_20 = (double)((in_XMM0_Da + in_XMM1_Da) / 2.0);
  local_28 = ABS((double)(in_XMM1_Da - in_XMM0_Da)) / 2.0;
  local_38 = local_28 * local_28 * (local_28 + local_28 + -1.0);
  local_40 = 100000.0;
  local_14 = in_XMM2_Da;
  local_10 = in_XMM1_Da;
  local_c = in_XMM0_Da;
  pdVar1 = std::min<double>(&local_38,&local_40);
  local_30 = *pdVar1;
  dVar2 = (local_28 * local_28) / local_30;
  dVar2 = sqrt(local_28 * local_28 + dVar2 * dVar2);
  local_14 = local_14 / 4.0;
  if ((local_15 & 1) == 0) {
    fprintf(*(FILE **)(in_RDI + 8),"%g 0 %g %g %g 0 %g %g A\n",(double)local_c,SUB84(local_20,0),
            -local_30,(double)local_10,dVar2,(double)local_14);
  }
  else {
    fprintf(*(FILE **)(in_RDI + 8),"%g 0 %g %g %g 0 %g %g A\n",(double)local_10,SUB84(local_20,0),
            local_30,(double)local_c,dVar2,(double)local_14);
  }
  return;
}

Assistant:

void edge(Float xi, Float xj, Float weight, bool top)
  {
    double x = (xi + xj) / 2;
    double d = fabs(xj - xi) / 2;
    double h = std::min(d * d * (2 * d - 1), 1e5);
    double y = d * d / h;
    double r = sqrt(d * d + y * y);
    weight /= 4;
    if (top)
      fprintf(file, "%g 0 %g %g %g 0 %g %g A\n", xj, x, +h, xi, r, weight);
    else
      fprintf(file, "%g 0 %g %g %g 0 %g %g A\n", xi, x, -h, xj, r, weight);
  }